

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.h
# Opt level: O1

void __thiscall Assimp::PLY::Element::~Element(Element *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->szName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->szName).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::~vector
            (&this->alProperties);
  return;
}

Assistant:

Element() AI_NO_EXCEPT
    : eSemantic (EEST_INVALID)
    , NumOccur(0) {
        // empty
    }